

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::~array_n
          (array_n<bool,_2,_std::allocator<bool>_> *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 1;
  lVar2 = 2;
  do {
    iVar1 = iVar1 * this->_dims[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 3);
  if (((this->_array != (bool *)0x0) && (this->first != this->last)) && (iVar1 != 0)) {
    operator_delete(this->first);
  }
  this->_array = (bool *)0x0;
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }